

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

size_t bin_read(io_buf *i,char *data,size_t len,char *read_message)

{
  undefined8 uVar1;
  size_t sVar2;
  char *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  io_buf *in_RDI;
  stringstream __msg;
  size_t ret;
  uint32_t obj_len;
  string *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_1b8 [16];
  ostream local_1a8;
  size_t local_30;
  uint local_24;
  
  local_30 = io_buf::bin_read_fixed(in_RDI,in_RSI,in_RDX,in_RCX);
  if ((local_24 <= in_RDX) && (3 < local_30)) {
    sVar2 = io_buf::bin_read_fixed(in_RDI,in_RSI,in_RDX,in_RCX);
    return sVar2 + local_30;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(&local_1a8,"bad model format!");
  uVar1 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe28);
  __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

inline size_t bin_read(io_buf& i, char* data, size_t len, const char* read_message)
{
  uint32_t obj_len;
  size_t ret = i.bin_read_fixed((char*)&obj_len, sizeof(obj_len), "");
  if (obj_len > len || ret < sizeof(uint32_t))
    THROW("bad model format!");

  ret += i.bin_read_fixed(data, obj_len, read_message);

  return ret;
}